

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall Liby::EventLoop::run(EventLoop *this,BoolFunctor *bf)

{
  _Head_base<0UL,_Liby::Poller_*,_false> _Var1;
  bool bVar2;
  
  EventQueue::start((this->equeue_)._M_t.
                    super___uniq_ptr_impl<Liby::EventQueue,_std::default_delete<Liby::EventQueue>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Liby::EventQueue_*,_std::default_delete<Liby::EventQueue>_>
                    .super__Head_base<0UL,_Liby::EventQueue_*,_false>._M_head_impl);
  TimerQueue::start((this->tqueue_)._M_t.
                    super___uniq_ptr_impl<Liby::TimerQueue,_std::default_delete<Liby::TimerQueue>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Liby::TimerQueue_*,_std::default_delete<Liby::TimerQueue>_>
                    .super__Head_base<0UL,_Liby::TimerQueue_*,_false>._M_head_impl);
  while( true ) {
    bVar2 = std::function<bool_()>::operator()(bf);
    if (!bVar2) break;
    _Var1._M_head_impl =
         (this->poller_)._M_t.
         super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>._M_t.
         super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
         super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl;
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_Poller + 0x28))(_Var1._M_head_impl,0);
  }
  return;
}

Assistant:

void EventLoop::run(BoolFunctor bf) {
    equeue_->start();
    tqueue_->start();

    while (bf()) {
#ifdef __APPLE__
        tqueue_->handleTimeoutEvents();

        Timestamp min;
        const Timestamp *pmin = tqueue_->getMinTimestamp();
        Timestamp *p = nullptr;
        if (pmin != nullptr) {
            min = *pmin;
            p = &min;
        }

        poller_->loop_once(p);

        tqueue_->handleTimeoutEvents();
#elif defined(__linux__)

        poller_->loop_once();

#endif
    }
}